

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tccpp.c
# Opt level: O3

int * macro_arg_subst(Sym **nested_list,int *macro_str,Sym *args)

{
  char *pcVar1;
  char cVar2;
  void *p;
  uint size;
  uint *puVar3;
  Sym *pSVar4;
  char *pcVar5;
  int *piVar6;
  int *piVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  anon_union_8_2_ebb9b702_for_Sym_6 aVar11;
  int iVar12;
  uint *puVar13;
  long lVar14;
  uint *puVar15;
  long lVar16;
  int iVar17;
  uint uVar18;
  TokenString local_108;
  Sym **local_c8;
  Sym *local_c0;
  TokenString local_b8;
  undefined8 local_80;
  CString local_78;
  int local_5c;
  uint *local_58;
  uint *local_50;
  undefined1 local_48 [8];
  CValue cval;
  
  local_b8.str = (int *)0x0;
  local_b8.len = 0;
  local_b8.lastlen = 0;
  local_b8.allocated_len = 0;
  local_b8.last_line_num = -1;
  puVar13 = (uint *)0x0;
  iVar17 = 0;
  local_c8 = nested_list;
  local_c0 = args;
  local_50 = (uint *)macro_str;
LAB_00125cbc:
  do {
    puVar3 = local_50 + 1;
    uVar9 = *local_50;
    iVar12 = (int)puVar13;
    switch(uVar9) {
    case 0xb3:
    case 0xb4:
    case 0xb5:
    case 0xc0:
      local_48 = (undefined1  [8])(long)(int)local_50[1];
      puVar3 = local_50 + 2;
      break;
    case 0xb6:
      local_48 = (undefined1  [8])(ulong)local_50[1];
      local_50 = local_50 + 2;
      goto LAB_00126227;
    case 0xb7:
    case 0xb8:
    case 0xbc:
    case 0xce:
    case 0xcf:
      iVar8 = 2;
      goto LAB_00125ce9;
    case 0xb9:
    case 0xba:
    case 0xbe:
    case 0xbf:
      cval.i = (uint64_t)(local_50 + 2);
      local_48._0_4_ = local_50[1];
      puVar3 = (uint *)((long)local_50 + ((long)(int)local_50[1] + 3U & 0xfffffffffffffffc) + 8);
      break;
    case 0xbb:
      puVar13 = local_50 + 1;
      local_50 = local_50 + 2;
      local_48._0_4_ = *puVar13;
      goto LAB_00126227;
    case 0xbd:
      iVar8 = 4;
LAB_00125ce9:
      lVar16 = 0;
      do {
        *(undefined4 *)(local_48 + lVar16) = *(undefined4 *)((long)puVar3 + lVar16);
        lVar16 = lVar16 + 4;
      } while (iVar8 << 2 != (int)lVar16);
      puVar3 = (uint *)((long)puVar3 + lVar16);
switchD_00125ce2_caseD_c1:
      break;
    default:
      goto switchD_00125ce2_caseD_c1;
    }
    if (uVar9 != 0x23) {
      if (uVar9 == 0) {
        lVar16 = (long)local_b8.len;
        if (local_b8.allocated_len <= local_b8.len) {
          iVar17 = 0x10;
          if (0x10 < local_b8.allocated_len) {
            iVar17 = local_b8.allocated_len;
          }
          do {
            iVar12 = iVar17;
            iVar17 = iVar12 * 2;
          } while (iVar12 <= local_b8.len);
          local_b8.str = (int *)tal_realloc_impl(&tokstr_alloc,local_b8.str,iVar12 << 2);
        }
        local_b8.str[lVar16] = 0;
        return local_b8.str;
      }
      local_50 = puVar3;
      if ((int)uVar9 < 0x100) {
LAB_00126227:
        tok_str_add2(&local_b8,uVar9,(CValue *)local_48);
        puVar13 = (uint *)(ulong)uVar9;
        iVar17 = iVar12;
      }
      else {
        local_58 = (uint *)(ulong)uVar9;
        pSVar4 = sym_find2(local_c0,uVar9);
        iVar8 = local_b8.len;
        lVar16 = (long)local_b8.len;
        if (pSVar4 != (Sym *)0x0) {
          piVar6 = (pSVar4->field_3).d;
          if ((iVar12 == 0xcd) || (*local_50 == 0xcd)) {
            local_5c = iVar12;
            if ((iVar12 != 0xcd) ||
               (((iVar17 != 0x2c || (gnu_ext == 0)) || ((pSVar4->type).t == 0)))) goto LAB_0012637b;
            if (*piVar6 < 1) {
              local_b8.len = local_b8.len + -2;
              goto LAB_0012637b;
            }
            local_b8.len = local_b8.len + -1;
          }
          aVar11 = pSVar4->field_5;
          local_5c = iVar12;
          if (aVar11.next == (Sym *)0x0) {
            local_80 = &pSVar4->field_5;
            sym_push2(&local_80->next,pSVar4->v,(pSVar4->type).t,0);
            local_108.str = (int *)0x0;
            local_108.len = 0;
            local_108.lastlen = 0;
            local_108.allocated_len = 0;
            local_108.last_line_num = -1;
            macro_subst(&local_108,local_c8,piVar6);
            lVar14 = (long)local_108.len;
            piVar6 = local_108.str;
            if (local_108.allocated_len <= local_108.len) {
              iVar17 = local_108.allocated_len;
              if (local_108.allocated_len < 0x11) {
                iVar17 = 0x10;
              }
              do {
                iVar12 = iVar17;
                iVar17 = iVar12 * 2;
              } while (iVar12 <= local_108.len);
              piVar6 = (int *)tal_realloc_impl(&tokstr_alloc,local_108.str,iVar12 << 2);
            }
            piVar6[lVar14] = 0;
            (local_80->next->field_3).d = piVar6;
            aVar11.next = *(Sym **)local_80;
          }
          piVar6 = *(int **)((long)aVar11 + 8);
LAB_0012637b:
          do {
            iVar17 = local_5c;
            piVar7 = piVar6 + 1;
            iVar12 = *piVar6;
            switch(iVar12) {
            case 0xb3:
            case 0xb4:
            case 0xb5:
            case 0xc0:
              local_48 = (undefined1  [8])(long)piVar6[1];
              goto LAB_0012632c;
            case 0xb6:
              local_48 = (undefined1  [8])(ulong)(uint)piVar6[1];
LAB_0012632c:
              piVar7 = piVar6 + 2;
              break;
            case 0xb7:
            case 0xb8:
            case 0xbc:
            case 0xce:
            case 0xcf:
              iVar10 = 2;
              goto LAB_001263a2;
            case 0xb9:
            case 0xba:
            case 0xbe:
            case 0xbf:
              cval.i = (uint64_t)(piVar6 + 2);
              local_48._0_4_ = piVar6[1];
              piVar7 = (int *)((long)piVar6 + ((long)piVar6[1] + 3U & 0xfffffffffffffffc) + 8);
              break;
            case 0xbb:
              piVar7 = piVar6 + 2;
              local_48._0_4_ = piVar6[1];
              break;
            case 0xbd:
              iVar10 = 4;
LAB_001263a2:
              lVar14 = 0;
              do {
                *(undefined4 *)(local_48 + lVar14) = *(undefined4 *)((long)piVar7 + lVar14);
                lVar14 = lVar14 + 4;
              } while (iVar10 << 2 != (int)lVar14);
              piVar7 = (int *)((long)piVar7 + lVar14);
switchD_0012639b_caseD_c1:
              if (iVar12 < 1) goto code_r0x001263c0;
              break;
            default:
              goto switchD_0012639b_caseD_c1;
            }
            tok_str_add2(&local_b8,iVar12,(CValue *)local_48);
            piVar6 = piVar7;
          } while( true );
        }
        if (local_b8.allocated_len <= local_b8.len) {
          iVar17 = local_b8.allocated_len;
          if (local_b8.allocated_len < 0x11) {
            iVar17 = 0x10;
          }
          do {
            iVar10 = iVar17;
            iVar17 = iVar10 * 2;
          } while (iVar10 <= local_b8.len);
          local_b8.str = (int *)tal_realloc_impl(&tokstr_alloc,local_b8.str,iVar10 * 4);
          local_b8.allocated_len = iVar10;
        }
        local_b8.len = iVar8 + 1;
        local_b8.str[lVar16] = (int)local_58;
        puVar13 = local_58;
        iVar17 = iVar12;
      }
      goto LAB_00125cbc;
    }
    local_50 = puVar3 + 1;
    uVar9 = *puVar3;
    puVar13 = (uint *)(ulong)uVar9;
    switch(uVar9) {
    case 0xb3:
    case 0xb4:
    case 0xb5:
    case 0xc0:
      local_48 = (undefined1  [8])(long)(int)puVar3[1];
      goto LAB_00125e6f;
    case 0xb6:
      local_48 = (undefined1  [8])(ulong)puVar3[1];
LAB_00125e6f:
      local_50 = puVar3 + 2;
      break;
    case 0xb7:
    case 0xb8:
    case 0xbc:
    case 0xce:
    case 0xcf:
      iVar17 = 2;
      goto LAB_00125e41;
    case 0xb9:
    case 0xba:
    case 0xbe:
    case 0xbf:
      cval.i = (uint64_t)(puVar3 + 2);
      local_48._0_4_ = puVar3[1];
      local_50 = (uint *)((long)puVar3 + ((long)(int)puVar3[1] + 3U & 0xfffffffffffffffc) + 8);
      break;
    case 0xbb:
      local_50 = puVar3 + 2;
      local_48._0_4_ = puVar3[1];
      break;
    case 0xbd:
      iVar17 = 4;
LAB_00125e41:
      lVar16 = 0;
      do {
        *(undefined4 *)(local_48 + lVar16) = *(undefined4 *)((long)local_50 + lVar16);
        lVar16 = lVar16 + 4;
      } while (iVar17 << 2 != (int)lVar16);
      local_50 = (uint *)((long)local_50 + lVar16);
switchD_00125e3a_caseD_c1:
      local_5c = iVar12;
      if (uVar9 == 0) goto LAB_001264a3;
      break;
    default:
      goto switchD_00125e3a_caseD_c1;
    }
    local_5c = iVar12;
    pSVar4 = sym_find2(local_c0,uVar9);
    if (pSVar4 == (Sym *)0x0) {
LAB_001264a3:
      expect("macro parameter after \'#\'");
    }
    local_78.size = 0;
    local_78._4_4_ = 0;
    local_78.data = (void *)0x0;
    local_78.size_allocated = 0;
    local_78._20_4_ = 0;
    uVar18 = 8;
    local_78.data = tal_realloc_impl(&cstr_alloc,(void *)0x0,8);
    local_78.size_allocated = 8;
    *(undefined1 *)local_78.data = 0x22;
    local_78.size = 1;
    puVar3 = (uint *)(pSVar4->field_3).d;
    uVar9 = *puVar3;
    if ((int)uVar9 < 0) {
      iVar17 = 1;
    }
    else {
      local_80 = (anon_union_8_2_ebb9b702_for_Sym_6 *)((ulong)local_80 & 0xffffffff00000000);
      do {
        puVar13 = (uint *)(ulong)uVar9;
        puVar15 = puVar3 + 1;
        switch(uVar9) {
        case 0xb3:
        case 0xb4:
        case 0xb5:
        case 0xc0:
          local_48 = (undefined1  [8])(long)(int)puVar3[1];
          break;
        case 0xb6:
          local_48 = (undefined1  [8])(ulong)puVar3[1];
          break;
        case 0xb7:
        case 0xb8:
        case 0xbc:
        case 0xce:
        case 0xcf:
          iVar17 = 2;
          goto LAB_00125f36;
        case 0xb9:
        case 0xba:
        case 0xbe:
        case 0xbf:
          cval.i = (uint64_t)(puVar3 + 2);
          local_48._0_4_ = puVar3[1];
          puVar3 = (uint *)((long)puVar3 + ((long)(int)puVar3[1] + 3U & 0xfffffffffffffffc) + 8);
          goto LAB_00125f98;
        case 0xbb:
          local_48._0_4_ = puVar3[1];
          break;
        case 0xbd:
          iVar17 = 4;
LAB_00125f36:
          lVar16 = 0;
          do {
            *(undefined4 *)(local_48 + lVar16) = *(undefined4 *)((long)puVar15 + lVar16);
            lVar16 = lVar16 + 4;
          } while (iVar17 << 2 != (int)lVar16);
          puVar15 = (uint *)((long)puVar15 + lVar16);
switchD_00125f2f_caseD_c1:
          puVar3 = puVar15;
          if (uVar9 - 0xcd < 0xfffffffe) {
            if (uVar9 < 0x100) goto LAB_00125f98;
            goto LAB_00125fa9;
          }
          goto LAB_00126078;
        default:
          goto switchD_00125f2f_caseD_c1;
        }
        puVar3 = puVar3 + 2;
LAB_00125f98:
        puVar15 = puVar3;
        if ((*(byte *)((long)puVar13 + 0x15cb01) & 1) == 0) {
LAB_00125fa9:
          local_80 = (anon_union_8_2_ebb9b702_for_Sym_6 *)((ulong)local_80._4_4_ << 0x20);
          local_58 = puVar15;
LAB_00125fcb:
          pcVar5 = get_tok_str(uVar9,(CValue *)local_48);
          cVar2 = *pcVar5;
          puVar3 = local_58;
          while (local_58 = puVar3, cVar2 != '\0') {
            if (cVar2 == '\'' || uVar9 != 0xbf) {
              iVar17 = local_78.size;
              lVar16 = (long)local_78.size;
              if (local_78.size_allocated <= local_78.size) {
                uVar18 = local_78.size_allocated;
                if (local_78.size_allocated < 9) {
                  uVar18 = 8;
                }
                do {
                  size = uVar18;
                  uVar18 = size * 2;
                } while ((int)size <= local_78.size);
                local_78.data = tal_realloc_impl(&cstr_alloc,local_78.data,size);
                local_78.size_allocated = size;
              }
              *(char *)((long)local_78.data + lVar16) = cVar2;
              local_78.size = iVar17 + 1;
            }
            else {
              add_char(&local_78,(int)cVar2);
            }
            pcVar1 = pcVar5 + 1;
            pcVar5 = pcVar5 + 1;
            puVar3 = local_58;
            cVar2 = *pcVar1;
          }
        }
        else if ((int)local_80 == 0) {
          local_80 = (anon_union_8_2_ebb9b702_for_Sym_6 *)CONCAT44(local_80._4_4_,1);
          local_58 = puVar3;
          goto LAB_00125fcb;
        }
LAB_00126078:
        uVar9 = *puVar3;
      } while (-1 < (int)uVar9);
      iVar17 = local_78.size - (int)local_80;
      uVar18 = local_78.size_allocated;
      if (local_78.size_allocated <= iVar17) {
        uVar9 = local_78.size_allocated;
        if (local_78.size_allocated < 9) {
          uVar9 = 8;
        }
        do {
          uVar18 = uVar9;
          uVar9 = uVar18 * 2;
        } while ((int)uVar18 <= iVar17);
        local_78.data = tal_realloc_impl(&cstr_alloc,local_78.data,uVar18);
      }
    }
    *(undefined1 *)((long)local_78.data + (long)iVar17) = 0x22;
    lVar16 = (long)iVar17 + 1;
    iVar12 = (int)lVar16;
    local_58 = puVar13;
    if ((int)uVar18 <= iVar12) {
      if ((int)uVar18 < 9) {
        uVar18 = 8;
      }
      do {
        uVar9 = uVar18;
        uVar18 = uVar9 * 2;
      } while ((int)uVar9 <= iVar12);
      local_78.data = tal_realloc_impl(&cstr_alloc,local_78.data,uVar9);
      local_78.size_allocated = uVar9;
    }
    p = local_78.data;
    *(undefined1 *)((long)local_78.data + lVar16) = 0;
    local_78.size = iVar17 + 2;
    local_48._0_4_ = iVar17 + 2;
    cval.i = (uint64_t)local_78.data;
    tok_str_add2(&local_b8,0xbf,(CValue *)local_48);
    tal_free_impl(cstr_alloc,p);
    local_78.size = 0;
    local_78._4_4_ = 0;
    local_78.data = (void *)0x0;
    local_78.size_allocated = 0;
    local_78._20_4_ = 0;
    puVar13 = local_58;
    iVar17 = local_5c;
  } while( true );
code_r0x001263c0:
  puVar13 = local_58;
  if (local_b8.len == iVar8) {
    if (local_b8.allocated_len <= iVar8) {
      iVar12 = local_b8.allocated_len;
      if (local_b8.allocated_len < 0x11) {
        iVar12 = 0x10;
      }
      do {
        iVar10 = iVar12;
        iVar12 = iVar10 * 2;
      } while (iVar10 <= iVar8);
      local_b8.str = (int *)tal_realloc_impl(&tokstr_alloc,local_b8.str,iVar10 * 4);
      local_b8.allocated_len = iVar10;
    }
    local_b8.len = iVar8 + 1;
    local_b8.str[lVar16] = 0xcb;
    puVar13 = local_58;
  }
  goto LAB_00125cbc;
}

Assistant:

static int* macro_arg_subst(Sym** nested_list, const int* macro_str, Sym* args) {
  int t, t0, t1, spc;
  const int* st;
  Sym* s;
  CValue cval;
  TokenString str;
  CString cstr;

  tok_str_new(&str);
  t0 = t1 = 0;
  while (1) {
    TOK_GET(&t, &macro_str, &cval);
    if (!t)
      break;
    if (t == '#') {
      /* stringize */
      TOK_GET(&t, &macro_str, &cval);
      if (!t)
        goto bad_stringy;
      s = sym_find2(args, t);
      if (s) {
        cstr_new(&cstr);
        cstr_ccat(&cstr, '\"');
        st = s->d;
        spc = 0;
        while (*st >= 0) {
          TOK_GET(&t, &st, &cval);
          if (t != TOK_PLCHLDR && t != TOK_NOSUBST && 0 == check_space(t, &spc)) {
            const char* s = get_tok_str(t, &cval);
            while (*s) {
              if (t == TOK_PPSTR && *s != '\'')
                add_char(&cstr, *s);
              else
                cstr_ccat(&cstr, *s);
              ++s;
            }
          }
        }
        cstr.size -= spc;
        cstr_ccat(&cstr, '\"');
        cstr_ccat(&cstr, '\0');
#ifdef PP_DEBUG
        printf("\nstringize: <%s>\n", (char*)cstr.data);
#endif
        /* add string */
        cval.str.size = cstr.size;
        cval.str.data = cstr.data;
        tok_str_add2(&str, TOK_PPSTR, &cval);
        cstr_free(&cstr);
      } else {
      bad_stringy:
        expect("macro parameter after '#'");
      }
    } else if (t >= TOK_IDENT) {
      s = sym_find2(args, t);
      if (s) {
        int l0 = str.len;
        st = s->d;
        /* if '##' is present before or after, no arg substitution */
        if (*macro_str == TOK_PPJOIN || t1 == TOK_PPJOIN) {
          /* special case for var arg macros : ## eats the ','
             if empty VA_ARGS variable. */
          if (t1 == TOK_PPJOIN && t0 == ',' && gnu_ext && s->type.t) {
            if (*st <= 0) {
              /* suppress ',' '##' */
              str.len -= 2;
            } else {
              /* suppress '##' and add variable */
              str.len--;
              goto add_var;
            }
          }
        } else {
        add_var:
          if (!s->next) {
            /* Expand arguments tokens and store them.  In most
               cases we could also re-expand each argument if
               used multiple times, but not if the argument
               contains the __COUNTER__ macro.  */
            TokenString str2;
            sym_push2(&s->next, s->v, s->type.t, 0);
            tok_str_new(&str2);
            macro_subst(&str2, nested_list, st);
            tok_str_add(&str2, 0);
            s->next->d = str2.str;
          }
          st = s->next->d;
        }
        for (;;) {
          int t2;
          TOK_GET(&t2, &st, &cval);
          if (t2 <= 0)
            break;
          tok_str_add2(&str, t2, &cval);
        }
        if (str.len == l0) /* expanded to empty string */
          tok_str_add(&str, TOK_PLCHLDR);
      } else {
        tok_str_add(&str, t);
      }
    } else {
      tok_str_add2(&str, t, &cval);
    }
    t0 = t1, t1 = t;
  }
  tok_str_add(&str, 0);
  return str.str;
}